

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

void __thiscall tcb::rational<long_long>::simplify(rational<long_long> *this)

{
  longlong lVar1;
  longlong lVar2;
  longlong g;
  rational<long_long> *this_local;
  
  lVar1 = detail::gcd<long_long>(this->num_,this->denom_);
  lVar1 = detail::abs<long_long>(lVar1);
  lVar2 = detail::sign<long_long>(this->denom_);
  this->num_ = (lVar2 * this->num_) / lVar1;
  lVar2 = detail::abs<long_long>(this->denom_);
  this->denom_ = lVar2 / lVar1;
  return;
}

Assistant:

TCB_CONSTEXPR14 void simplify()
    {
        using namespace detail;
        auto g = abs(gcd(num_, denom_));
        num_ = sign(denom_) * num_/g;
        denom_ = abs(denom_)/g;
    }